

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_CreateTapScriptControl_Elements_Sign_Test::TestBody
          (TaprootUtil_CreateTapScriptControl_Elements_Sign_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ScriptBuilder *pSVar3;
  reference this_00;
  reference pvVar4;
  char *in_R9;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *utxo_list_00;
  string local_17d8;
  AssertHelper local_17b8;
  Message local_17b0;
  bool local_17a1;
  undefined1 local_17a0 [8];
  AssertionResult gtest_ar__4;
  Message local_1788;
  string local_1780;
  undefined1 local_1760 [8];
  AssertionResult gtest_ar_15;
  ByteData local_1730;
  ScriptWitness local_1718;
  ByteData local_16f8;
  ScriptWitness local_16e0;
  undefined1 local_16c0 [8];
  SchnorrSignature schnorr_sig;
  Message local_1690;
  string local_1688;
  undefined1 local_1668 [8];
  AssertionResult gtest_ar_14;
  SchnorrSignature sig2;
  Message local_1628;
  string local_1620;
  undefined1 local_1600 [8];
  AssertionResult gtest_ar_13;
  SigHashType local_15d4;
  undefined1 local_15c8 [8];
  ByteData256 sighash2;
  undefined1 local_1598 [8];
  TapScriptData script_data;
  SigHashType sighash_type;
  undefined1 local_1548 [8];
  BlockHash genesis_block_hash;
  ConfidentialValue local_1518;
  allocator local_14e9;
  string local_14e8;
  Script local_14c8;
  ConfidentialTxOut local_1490;
  Amount local_1398;
  ConfidentialValue local_1388;
  allocator local_1359;
  string local_1358;
  Script local_1338;
  ConfidentialTxOut local_1300;
  allocator<cfd::core::ConfidentialTxOut> local_1201;
  undefined1 local_1200 [8];
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxo_list;
  string local_11e0;
  undefined1 local_11c0 [8];
  ConfidentialAssetId asset;
  string local_1190;
  undefined1 local_1170 [8];
  ConfidentialTransaction tx1;
  AssertHelper local_1110;
  Message local_1108;
  TaprootScriptTree local_1100;
  bool local_1061;
  undefined1 local_1060 [8];
  AssertionResult gtest_ar__3;
  Message local_1048;
  TaprootScriptTree local_1040;
  string local_fa8;
  string local_f88;
  undefined1 local_f68 [8];
  AssertionResult gtest_ar_12;
  Message local_f50;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_f48;
  SchnorrPubkey local_f30;
  string local_f18;
  undefined1 local_ef8 [8];
  AssertionResult gtest_ar_11;
  Message local_ee0;
  Script local_ed8;
  string local_ea0;
  undefined1 local_e80 [8];
  AssertionResult gtest_ar_10;
  Message local_e68;
  string local_e60;
  undefined1 local_e40 [8];
  AssertionResult gtest_ar_9;
  Address addr;
  DescriptorScriptReference ref;
  string local_940;
  undefined1 local_920 [8];
  Descriptor desc;
  AssertHelper local_790;
  Message local_788;
  bool local_779;
  undefined1 local_778 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_748;
  Message local_740;
  bool local_731;
  undefined1 local_730 [8];
  AssertionResult gtest_ar__1;
  Message local_718;
  Script local_710;
  string local_6d8;
  undefined1 local_6b8 [8];
  AssertionResult gtest_ar_8;
  Message local_6a0;
  Script local_698;
  string local_660;
  string local_640;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_7;
  Message local_608;
  string local_600;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar_6;
  undefined1 local_5b8 [8];
  Address addr01;
  Message local_430;
  string local_428;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_5;
  ByteData taproot_control;
  SchnorrPubkey pk0;
  Script locking_script;
  Message local_388;
  SchnorrPubkey local_380;
  string local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_4;
  Message local_330;
  ByteData256 local_328;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_3;
  Message local_2d8;
  ByteData256 local_2d0;
  string local_2b8;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_2;
  Message local_280;
  string local_278;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_1;
  TaprootScriptTree tree;
  undefined1 local_1a8 [4];
  NetType net_type;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ScriptBuilder local_178;
  undefined1 local_158 [8];
  Script redeem_script;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_;
  Message local_d8;
  string local_d0;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_80 [7];
  bool is_parity;
  Pubkey pubkey;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Privkey key;
  TaprootUtil_CreateTapScriptControl_Elements_Sign_Test *this_local;
  
  key._24_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"cQRxS6BoPsuT8nyHMCYAKsRVDSnLisMxw4gUTeMURKioMMxTMSPE",&local_51);
  cfd::core::Privkey::FromWif((Privkey *)local_30,&local_50,kCustomChain,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  cfd::core::Privkey::GeneratePubkey((Pubkey *)local_80,(Privkey *)local_30,true);
  schnorr_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  cfd::core::SchnorrPubkey::FromPubkey
            ((SchnorrPubkey *)&gtest_ar.message_,(Pubkey *)local_80,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_d0,(SchnorrPubkey *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_b0,
             "\"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e\"",
             "schnorr_pubkey.GetHex()",
             (char (*) [65])"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
             &local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xe2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f0,
             (bool *)((long)&schnorr_pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_f0,
               (AssertionResult *)"is_parity","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xe3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string
              ((string *)
               &redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  cfd::core::ScriptBuilder::ScriptBuilder(&local_178);
  cfd::core::SchnorrPubkey::GetData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(SchnorrPubkey *)&gtest_ar.message_)
  ;
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (&local_178,
                      (ByteData *)
                      &nodes.
                       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar3 = cfd::core::ScriptBuilder::operator<<
                     (pSVar3,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build((Script *)local_158,pSVar3);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ScriptBuilder::~ScriptBuilder(&local_178);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1a8);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&gtest_ar_1.message_,(Script *)local_158,kElementsRegtest);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_278,(TapBranch *)&gtest_ar_1.message_);
  testing::internal::EqHelper<false>::Compare<char[73],std::__cxx11::string>
            ((EqHelper<false> *)local_258,
             "\"tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)\"",
             "tree.ToString()",
             (char (*) [73])
             "tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)",&local_278);
  std::__cxx11::string::~string((string *)&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  cfd::core::TaprootScriptTree::GetTapLeafHash(&local_2d0,(TaprootScriptTree *)&gtest_ar_1.message_)
  ;
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_2b8,&local_2d0);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_298,
             "\"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0",
             &local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  cfd::core::ByteData256::~ByteData256(&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xeb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  cfd::core::TapBranch::GetCurrentBranchHash(&local_328,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_310,&local_328);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_2f0,
             "\"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0\"",
             "tree.GetCurrentBranchHash().GetHex()",
             (char (*) [65])"28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0",
             &local_310);
  std::__cxx11::string::~string((string *)&local_310);
  cfd::core::ByteData256::~ByteData256(&local_328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  cfd::core::TapBranch::GetTweakedPubkey
            (&local_380,(TapBranch *)&gtest_ar_1.message_,(SchnorrPubkey *)&gtest_ar.message_,
             (bool *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_368,&local_380);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_348,
             "\"bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "tree.GetTweakedPubkey(schnorr_pubkey).GetHex()",(char (*) [65])0x73c5c6,&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &locking_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xed,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &locking_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_388);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &locking_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  cfd::core::Script::Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&gtest_ar_5.message_,(SchnorrPubkey *)&gtest_ar.message_,
             (TapBranch *)&gtest_ar_1.message_,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_428,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_408,
             "\"bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"","pk0.GetHex()",
             (char (*) [65])0x73c5c6,&local_428);
  std::__cxx11::string::~string((string *)&local_428);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar1) {
    testing::Message::Message(&local_430);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_430
              );
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &addr01.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    testing::Message::~Message(&local_430);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_5b8,kCfdInvalidSettingError,kVersion1,
             (SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar_6.message_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &gtest_ar_6.message_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_600,(Address *)local_5b8);
  testing::internal::EqHelper<false>::Compare<char[64],std::__cxx11::string>
            ((EqHelper<false> *)local_5e0,
             "\"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz\"",
             "addr01.GetAddress()",
             (char (*) [64])"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz",
             &local_600);
  std::__cxx11::string::~string((string *)&local_600);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_640,
             (Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Address::GetLockingScript(&local_698,(Address *)local_5b8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_660,&local_698);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_620,"locking_script.GetHex()",
             "addr01.GetLockingScript().GetHex()",&local_640,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  cfd::core::Script::~Script(&local_698);
  std::__cxx11::string::~string((string *)&local_640);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  cfd::core::Address::GetLockingScript(&local_710,(Address *)local_5b8);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6d8,&local_710);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_6b8,
             "\"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "addr01.GetLockingScript().GetHex()",
             (char (*) [69])"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495",
             &local_6d8);
  std::__cxx11::string::~string((string *)&local_6d8);
  cfd::core::Script::~Script(&local_710);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6b8);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6b8);
  local_731 = cfd::core::TapBranch::HasTapLeaf((TapBranch *)&gtest_ar_1.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_730,&local_731,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_730,
               (AssertionResult *)"tree.HasTapLeaf()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  local_779 = cfd::core::TapBranch::IsElements((TapBranch *)&gtest_ar_1.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_778,&local_779,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&desc.root_node_.network_type_,(internal *)local_778,
               (AssertionResult *)"tree.IsElements()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xf8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&desc.root_node_.network_type_);
    testing::Message::~Message(&local_788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_940,
             "tr(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e,pk(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e))"
             ,(allocator *)
              ((long)&ref.addr_prefixes_.
                      super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Descriptor::ParseElements((Descriptor *)local_920,&local_940);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Descriptor::GetReference
            ((DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (Descriptor *)local_920,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  cfd::core::DescriptorScriptReference::GenerateAddress
            ((Address *)&gtest_ar_9.message_,
             (DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             kElementsRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_e60,(Address *)&gtest_ar_9.message_);
  testing::internal::EqHelper<false>::Compare<char[64],std::__cxx11::string>
            ((EqHelper<false> *)local_e40,
             "\"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz\"",
             "addr.GetAddress()",
             (char (*) [64])"ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz",
             &local_e60);
  std::__cxx11::string::~string((string *)&local_e60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e40);
  if (!bVar1) {
    testing::Message::Message(&local_e68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xfd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_e68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_e68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e40);
  cfd::core::DescriptorScriptReference::GetLockingScript
            (&local_ed8,
             (DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Script::GetHex_abi_cxx11_(&local_ea0,&local_ed8);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_e80,
             "\"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495\"",
             "ref.GetLockingScript().GetHex()",
             (char (*) [69])"5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495",
             &local_ea0);
  std::__cxx11::string::~string((string *)&local_ea0);
  cfd::core::Script::~Script(&local_ed8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e80);
  if (!bVar1) {
    testing::Message::Message(&local_ee0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xfe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_ee0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_ee0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e80);
  cfd::core::DescriptorScriptReference::GetKeyList
            (&local_f48,
             (DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  this_00 = std::
            vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
            ::operator[](&local_f48,0);
  cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_f30,this_00);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_f18,&local_f30);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_ef8,
             "\"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e\"",
             "ref.GetKeyList()[0].GetSchnorrPubkey().GetHex()",
             (char (*) [65])"91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
             &local_f18);
  std::__cxx11::string::~string((string *)&local_f18);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_f30);
  std::vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  ::~vector(&local_f48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ef8);
  if (!bVar1) {
    testing::Message::Message(&local_f50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_ef8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0xff,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_f50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_f50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ef8);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_f88,(TapBranch *)&gtest_ar_1.message_);
  cfd::core::DescriptorScriptReference::GetScriptTree
            (&local_1040,
             (DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::TapBranch::ToString_abi_cxx11_(&local_fa8,&local_1040.super_TapBranch);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_f68,"tree.ToString()","ref.GetScriptTree().ToString()",
             &local_f88,&local_fa8);
  std::__cxx11::string::~string((string *)&local_fa8);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1040);
  std::__cxx11::string::~string((string *)&local_f88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f68);
  if (!bVar1) {
    testing::Message::Message(&local_1048);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x100,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_1048);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1048);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f68);
  cfd::core::DescriptorScriptReference::GetScriptTree
            (&local_1100,
             (DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_1061 = cfd::core::TapBranch::IsElements(&local_1100.super_TapBranch);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1060,&local_1061,(type *)0x0);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&local_1100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1060);
  if (!bVar1) {
    testing::Message::Message(&local_1108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &tx1.vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_1060,
               (AssertionResult *)"ref.GetScriptTree().IsElements()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x101,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1110,&local_1108);
    testing::internal::AssertHelper::~AssertHelper(&local_1110);
    std::__cxx11::string::~string
              ((string *)
               &tx1.vout_.
                super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1060);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1190,
             "020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000140396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494000000000000000000"
             ,(allocator *)&asset.field_0x27);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_1170,&local_1190);
  std::__cxx11::string::~string((string *)&local_1190);
  std::allocator<char>::~allocator((allocator<char> *)&asset.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_11e0,
             "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             (allocator *)
             ((long)&utxo_list.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_11c0,&local_11e0)
  ;
  std::__cxx11::string::~string((string *)&local_11e0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&utxo_list.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<cfd::core::ConfidentialTxOut>::allocator(&local_1201);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::vector
            ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
             local_1200,2,&local_1201);
  std::allocator<cfd::core::ConfidentialTxOut>::~allocator(&local_1201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1358,
             "512016f8551db6483d403e9bf3c0b74a5bbafaa20cf0e45ca7e4a35cae924f7a0514",&local_1359);
  cfd::core::Script::Script(&local_1338,&local_1358);
  cfd::core::Amount::Amount(&local_1398,200000000);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1388,&local_1398);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_1300,&local_1338,(ConfidentialAssetId *)local_11c0,&local_1388);
  pvVar4 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ::operator[]((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                         *)local_1200,0);
  cfd::core::ConfidentialTxOut::operator=(pvVar4,&local_1300);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_1300);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1388);
  cfd::core::Script::~Script(&local_1338);
  std::__cxx11::string::~string((string *)&local_1358);
  std::allocator<char>::~allocator((allocator<char> *)&local_1359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14e8,
             "5120e247cebb9d05e3ce87133b3c6cfd15eed31b43f61fe3ceede12594e55966035b",&local_14e9);
  cfd::core::Script::Script(&local_14c8,&local_14e8);
  cfd::core::Amount::Amount
            ((Amount *)
             &genesis_block_hash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,200000000);
  cfd::core::ConfidentialValue::ConfidentialValue
            (&local_1518,
             (Amount *)
             &genesis_block_hash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (&local_1490,&local_14c8,(ConfidentialAssetId *)local_11c0,&local_1518);
  pvVar4 = std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ::operator[]((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                         *)local_1200,1);
  cfd::core::ConfidentialTxOut::operator=(pvVar4,&local_1490);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_1490);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_1518);
  cfd::core::Script::~Script(&local_14c8);
  std::__cxx11::string::~string((string *)&local_14e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&sighash_type.is_anyone_can_pay_,
             "cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338",
             (allocator *)((long)&sighash_type.hash_algorithm_ + 3));
  cfd::core::BlockHash::BlockHash
            ((BlockHash *)local_1548,(string *)&sighash_type.is_anyone_can_pay_);
  std::__cxx11::string::~string((string *)&sighash_type.is_anyone_can_pay_);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sighash_type.hash_algorithm_ + 3));
  cfd::core::SigHashType::SigHashType
            ((SigHashType *)&script_data.code_separator_position,kSigHashDefault,false,false);
  cfd::core::TapScriptData::TapScriptData((TapScriptData *)local_1598);
  cfd::core::TaprootScriptTree::GetTapLeafHash
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (TaprootScriptTree *)&gtest_ar_1.message_);
  cfd::core::ByteData256::operator=
            ((ByteData256 *)local_1598,
             (ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData256::~ByteData256
            ((ByteData256 *)
             &sighash2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  script_data.tap_leaf_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  cfd::core::SigHashType::SigHashType
            (&local_15d4,(SigHashType *)&script_data.code_separator_position);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar_13.message_);
  utxo_list_00 = (vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                  *)local_1200;
  cfd::core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
            ((ByteData256 *)local_15c8,(ConfidentialTransaction *)local_1170,0,&local_15d4,
             (BlockHash *)local_1548,utxo_list_00,(TapScriptData *)local_1598,
             (ByteData *)&gtest_ar_13.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_13.message_);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1620,(ByteData256 *)local_15c8);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_1600,
             "\"b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb\"",
             "sighash2.GetHex()",
             (char (*) [65])"b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb",
             &local_1620);
  std::__cxx11::string::~string((string *)&local_1620);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1600);
  if (!bVar1) {
    testing::Message::Message(&local_1628);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1600);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x113,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_,&local_1628);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&sig2.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_1628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1600);
  cfd::core::SchnorrUtil::Sign
            ((SchnorrSignature *)&gtest_ar_14.message_,(ByteData256 *)local_15c8,(Privkey *)local_30
            );
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_
            (&local_1688,(SchnorrSignature *)&gtest_ar_14.message_,false);
  testing::internal::EqHelper<false>::Compare<char[129],std::__cxx11::string>
            ((EqHelper<false> *)local_1668,
             "\"4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8\""
             ,"sig2.GetHex()",
             (char (*) [129])
             "4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8"
             ,&local_1688);
  std::__cxx11::string::~string((string *)&local_1688);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1668);
  if (!bVar1) {
    testing::Message::Message(&local_1690);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1668);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x115,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_,&local_1690);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&schnorr_sig.sighash_type_.is_anyone_can_pay_);
    testing::Message::~Message(&local_1690);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1668);
  cfd::core::SchnorrSignature::SchnorrSignature
            ((SchnorrSignature *)local_16c0,(SchnorrSignature *)&gtest_ar_14.message_);
  cfd::core::SchnorrSignature::SetSigHashType
            ((SchnorrSignature *)local_16c0,(SigHashType *)&script_data.code_separator_position);
  cfd::core::SchnorrSignature::GetData(&local_16f8,(SchnorrSignature *)local_16c0,true);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_16e0,(ConfidentialTransaction *)local_1170,0,&local_16f8);
  cfd::core::ScriptWitness::~ScriptWitness(&local_16e0);
  cfd::core::ByteData::~ByteData(&local_16f8);
  cfd::core::Script::GetData(&local_1730,(Script *)local_158);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            (&local_1718,(ConfidentialTransaction *)local_1170,0,&local_1730);
  cfd::core::ScriptWitness::~ScriptWitness(&local_1718);
  cfd::core::ByteData::~ByteData(&local_1730);
  cfd::core::ConfidentialTransaction::AddScriptWitnessStack
            ((ScriptWitness *)&gtest_ar_15.message_,(ConfidentialTransaction *)local_1170,0,
             (ByteData *)&gtest_ar_5.message_);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&gtest_ar_15.message_);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_1780,(AbstractTransaction *)local_1170);
  testing::internal::EqHelper<false>::Compare<char[829],std::__cxx11::string>
            ((EqHelper<false> *)local_1760,
             "\"020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000\""
             ,"tx1.GetHex()",
             (char (*) [829])
             "020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000"
             ,&local_1780);
  std::__cxx11::string::~string((string *)&local_1780);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1760);
  if (!bVar1) {
    testing::Message::Message(&local_1788);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1760);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_1788);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1788);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1760);
  local_17a1 = cfd::core::SchnorrPubkey::Verify
                         ((SchnorrPubkey *)&gtest_ar.message_,(SchnorrSignature *)local_16c0,
                          (ByteData256 *)local_15c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17a0,&local_17a1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17a0);
  if (!bVar1) {
    testing::Message::Message(&local_17b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17d8,(internal *)local_17a0,
               (AssertionResult *)"schnorr_pubkey.Verify(schnorr_sig, sighash2)","false","true",
               (char *)utxo_list_00);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x11d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_17b8,&local_17b0);
    testing::internal::AssertHelper::~AssertHelper(&local_17b8);
    std::__cxx11::string::~string((string *)&local_17d8);
    testing::Message::~Message(&local_17b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17a0);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_16c0);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)&gtest_ar_14.message_);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_15c8);
  cfd::core::TapScriptData::~TapScriptData((TapScriptData *)local_1598);
  cfd::core::BlockHash::~BlockHash((BlockHash *)local_1548);
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::~vector
            ((vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> *)
             local_1200);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_11c0);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)local_1170);
  cfd::core::Address::~Address((Address *)&gtest_ar_9.message_);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &addr.format_data_.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cfd::core::Descriptor::~Descriptor((Descriptor *)local_920);
  cfd::core::Address::~Address((Address *)local_5b8);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_5.message_);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &taproot_control.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &pk0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootScriptTree::~TaprootScriptTree((TaprootScriptTree *)&gtest_ar_1.message_);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_1a8);
  cfd::core::Script::~Script((Script *)local_158);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)&gtest_ar.message_);
  cfd::core::Pubkey::~Pubkey((Pubkey *)local_80);
  cfd::core::Privkey::~Privkey((Privkey *)local_30);
  return;
}

Assistant:

TEST(TaprootUtil, CreateTapScriptControl_Elements_Sign) {
  Privkey key = Privkey::FromWif(
    "cQRxS6BoPsuT8nyHMCYAKsRVDSnLisMxw4gUTeMURKioMMxTMSPE");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script redeem_script = (ScriptBuilder() << schnorr_pubkey.GetData()
      << ScriptOperator::OP_CHECKSIG).Build();
  std::vector<ByteData256> nodes;
  NetType net_type = NetType::kElementsRegtest;
  TaprootScriptTree tree(redeem_script, net_type);
  EXPECT_EQ("tl(2091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac)", tree.ToString());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("28acef70865e49908679b8dd6c3751f82dc4099b1d3d37affa685e928adc43f0", tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  Script locking_script;
  SchnorrPubkey pk0;
  auto taproot_control = TaprootUtil::CreateTapScriptControl(
      schnorr_pubkey, tree, &pk0, &locking_script);
  EXPECT_EQ("bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", pk0.GetHex());
  Address addr01(net_type, WitnessVersion::kVersion1, pk0, GetElementsAddressFormatList());
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr01.GetAddress());
  EXPECT_EQ(locking_script.GetHex(), addr01.GetLockingScript().GetHex());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", addr01.GetLockingScript().GetHex());
  EXPECT_TRUE(tree.HasTapLeaf());
  EXPECT_TRUE(tree.IsElements());

  auto desc = Descriptor::ParseElements("tr(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e,pk(91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e))");
  auto ref = desc.GetReference();
  auto addr = ref.GenerateAddress(NetType::kElementsRegtest);
  EXPECT_EQ("ert1phh5m3ukqqvcqjf0rzsjfl6sd4t0zzjaafnngc3hcnz00exz5gj2s8a8rjz", addr.GetAddress());
  EXPECT_EQ("5120bde9b8f2c003300925e314249fea0daade214bbd4ce68c46f8989efc98544495", ref.GetLockingScript().GetHex());
  EXPECT_EQ("91d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e", ref.GetKeyList()[0].GetSchnorrPubkey().GetHex());
  EXPECT_EQ(tree.ToString(), ref.GetScriptTree().ToString());
  EXPECT_TRUE(ref.GetScriptTree().IsElements());

  ConfidentialTransaction tx1("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000140396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494000000000000000000");
  ConfidentialAssetId asset("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  std::vector<ConfidentialTxOut> utxo_list(2);
  utxo_list[0] = ConfidentialTxOut(
    Script("512016f8551db6483d403e9bf3c0b74a5bbafaa20cf0e45ca7e4a35cae924f7a0514"),
    asset, ConfidentialValue(Amount(200000000)));
  utxo_list[1] = ConfidentialTxOut(
    Script("5120e247cebb9d05e3ce87133b3c6cfd15eed31b43f61fe3ceede12594e55966035b"),
    asset, ConfidentialValue(Amount(200000000)));
  BlockHash genesis_block_hash("cc2641af46f536fba45aab6016f63e12a80e4c98bbb2686dafb22b9451cfe338");
  SigHashType sighash_type = SigHashType(SigHashAlgorithm::kSigHashDefault);
  TapScriptData script_data;
  script_data.tap_leaf_hash = tree.GetTapLeafHash();
  script_data.code_separator_position = cfd::core::kDefaultCodeSeparatorPosition;
  auto sighash2 = tx1.GetElementsSchnorrSignatureHash(
    0, sighash_type, genesis_block_hash, utxo_list, &script_data);
  EXPECT_EQ("b69db4132ff6a8e675a8fac89c94652e6331f09115ef3dfcb269842d0adba2cb", sighash2.GetHex());
  auto sig2 = SchnorrUtil::Sign(sighash2, key);
  EXPECT_EQ("4cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8", sig2.GetHex());
  SchnorrSignature schnorr_sig(sig2);
  schnorr_sig.SetSigHashType(sighash_type);
  tx1.AddScriptWitnessStack(0, schnorr_sig.GetData(true));
  tx1.AddScriptWitnessStack(0, redeem_script.GetData());
  tx1.AddScriptWitnessStack(0, taproot_control);
  EXPECT_EQ("020000000102f746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290100000000fffffffff746647f2fd02ecfd3f669184c1f45e12ab9296f763c2d650d3f9ed4f520b0290200000000ffffffff020125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000017d77c300016001423dc2db292ef54e171839e4a4391d8b45aefcd4b0125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000007d000000000000000000440396f2b94c6a81151d07faa26d5f5d7c751b62b1aea59ad7ed9d17fea60ef17e8e2eab28b55796ec0d01b0565c4658b279381674dcce633ee1851125ac762c494404cc7d481c42c342bcbbd39208980895218e94a65581783ce009c0832f98c507edc1e6755047e2155d5b344c8ca496a4ebefd0ec000c782b9c85277dbb264b5b8222091d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0eac21c491d3bd3d62082de37a6881c908f23ba6c357a2ad380dcaa5c50296a972603e0e000000000000000000", tx1.GetHex());

  EXPECT_TRUE(schnorr_pubkey.Verify(schnorr_sig, sighash2));
}